

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O2

string * __thiscall
deqp::sl::ShaderCase::specializeVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,ShaderCase *this,char *src,ValueBlock *valueBlock)

{
  int iVar1;
  pointer pVVar2;
  DataType DVar3;
  ulong uVar4;
  ostream *poVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  int ndx;
  long lVar11;
  allocator<char> local_551;
  char *local_550;
  char *local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  StringTemplate tmpl;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  ostringstream decl;
  ostringstream output;
  ostringstream setup;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&decl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&setup);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&output);
  uVar4 = (ulong)this->m_targetVersion;
  if (uVar4 < 7) {
    local_550 = *(char **)(&DAT_01dfe020 + uVar4 * 8);
    local_548 = *(char **)(&DAT_01dfe058 + uVar4 * 8);
  }
  else {
    local_548 = "out";
    local_550 = "in";
  }
  std::operator<<(&output.super_basic_ostream<char,_std::char_traits<char>_>,
                  "gl_Position = dEQP_Position;\n");
  poVar5 = std::operator<<(&decl.super_basic_ostream<char,_std::char_traits<char>_>,local_550);
  std::operator<<(poVar5," highp vec4 dEQP_Position;\n");
  lVar10 = 0x28;
  lVar11 = 0;
  do {
    pVVar2 = (valueBlock->values).
             super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(valueBlock->values).
                     super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x48) <= lVar11) {
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &params._M_t._M_impl.super__Rb_tree_header._M_header;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::stringbuf::str();
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&tmpl,(char (*) [13])0x18fc8cc,&local_540);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&params,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&tmpl);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tmpl);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::stringbuf::str();
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&tmpl,(char (*) [6])0x17022b3,&local_540);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&params,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&tmpl);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tmpl);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::stringbuf::str();
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&tmpl,(char (*) [7])0x19043af,&local_540);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&params,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&tmpl);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tmpl);
      std::__cxx11::string::~string((string *)&local_540);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[20],_const_char_(&)[12],_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&tmpl,(char (*) [20])"POSITION_FRAG_COLOR",(char (*) [12])0x1641b36);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&params,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&tmpl);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tmpl);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,src,&local_551);
      tcu::StringTemplate::StringTemplate(&tmpl,&local_540);
      std::__cxx11::string::~string((string *)&local_540);
      tcu::StringTemplate::specialize(__return_storage_ptr__,&tmpl,&params);
      tcu::StringTemplate::~StringTemplate(&tmpl);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&params._M_t);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&output);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&setup);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&decl);
      return __return_storage_ptr__;
    }
    pcVar9 = *(char **)((long)pVVar2 + lVar10 + -0x20);
    DVar3 = glu::getDataTypeFloatScalars(*(DataType *)((long)&pVVar2->storageType + lVar10));
    pcVar6 = glu::getDataTypeName(DVar3);
    pcVar7 = glu::getDataTypeName(*(DataType *)((long)&pVVar2->storageType + lVar10));
    iVar1 = *(int *)((long)pVVar2 + lVar10 + -0x28);
    if (iVar1 == 2) {
      DVar3 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar2->storageType + lVar10));
      pcVar8 = local_548;
      if (DVar3 != TYPE_FLOAT) {
        poVar5 = std::operator<<(&decl.super_basic_ostream<char,_std::char_traits<char>_>,local_548)
        ;
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,pcVar6);
        poVar5 = std::operator<<(poVar5," v_");
        poVar5 = std::operator<<(poVar5,pcVar9);
        std::operator<<(poVar5,";\n");
        poVar5 = std::operator<<(&decl.super_basic_ostream<char,_std::char_traits<char>_>,pcVar7);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,pcVar9);
        std::operator<<(poVar5,";\n");
        poVar5 = std::operator<<(&output.super_basic_ostream<char,_std::char_traits<char>_>,"v_");
        poVar5 = std::operator<<(poVar5,pcVar9);
        poVar5 = std::operator<<(poVar5," = ");
        poVar5 = std::operator<<(poVar5,pcVar6);
        pcVar6 = "(";
        goto LAB_00d64e98;
      }
LAB_00d64d7d:
      poVar5 = std::operator<<(&decl.super_basic_ostream<char,_std::char_traits<char>_>,pcVar8);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,pcVar9);
      pcVar9 = ";\n";
LAB_00d64eb2:
      std::operator<<(poVar5,pcVar9);
    }
    else if (iVar1 == 1) {
      DVar3 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar2->storageType + lVar10));
      pcVar8 = local_550;
      if (DVar3 == TYPE_FLOAT) goto LAB_00d64d7d;
      poVar5 = std::operator<<(&decl.super_basic_ostream<char,_std::char_traits<char>_>,local_550);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5," a_");
      poVar5 = std::operator<<(poVar5,pcVar9);
      std::operator<<(poVar5,";\n");
      poVar5 = std::operator<<(&setup.super_basic_ostream<char,_std::char_traits<char>_>,pcVar7);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,pcVar9);
      poVar5 = std::operator<<(poVar5," = ");
      poVar5 = std::operator<<(poVar5,pcVar7);
      pcVar6 = "(a_";
LAB_00d64e98:
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5,pcVar9);
      pcVar9 = ");\n";
      goto LAB_00d64eb2;
    }
    lVar11 = lVar11 + 1;
    lVar10 = lVar10 + 0x48;
  } while( true );
}

Assistant:

string ShaderCase::specializeVertexShader(const char* src, const ValueBlock& valueBlock)
{
	ostringstream decl;
	ostringstream setup;
	ostringstream output;
	const bool	usesInout = usesShaderInoutQualifiers(m_targetVersion);
	const char*   vtxIn		= usesInout ? "in" : "attribute";
	const char*   vtxOut	= usesInout ? "out" : "varying";

	// Output (write out position).
	output << "gl_Position = dEQP_Position;\n";

	// Declarations (position + attribute for each input, varying for each output).
	decl << vtxIn << " highp vec4 dEQP_Position;\n";
	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val		  = valueBlock.values[ndx];
		const char*				 valueName	= val.valueName.c_str();
		DataType				 floatType	= getDataTypeFloatScalars(val.dataType);
		const char*				 floatTypeStr = getDataTypeName(floatType);
		const char*				 refTypeStr   = getDataTypeName(val.dataType);

		if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
		{
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
			{
				decl << vtxIn << " " << floatTypeStr << " " << valueName << ";\n";
			}
			else
			{
				decl << vtxIn << " " << floatTypeStr << " a_" << valueName << ";\n";
				setup << refTypeStr << " " << valueName << " = " << refTypeStr << "(a_" << valueName << ");\n";
			}
		}
		else if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
		{
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				decl << vtxOut << " " << floatTypeStr << " " << valueName << ";\n";
			else
			{
				decl << vtxOut << " " << floatTypeStr << " v_" << valueName << ";\n";
				decl << refTypeStr << " " << valueName << ";\n";

				output << "v_" << valueName << " = " << floatTypeStr << "(" << valueName << ");\n";
			}
		}
	}

	// Shader specialization.
	map<string, string> params;
	params.insert(pair<string, string>("DECLARATIONS", decl.str()));
	params.insert(pair<string, string>("SETUP", setup.str()));
	params.insert(pair<string, string>("OUTPUT", output.str()));
	params.insert(pair<string, string>("POSITION_FRAG_COLOR", "gl_Position"));

	StringTemplate tmpl(src);
	return tmpl.specialize(params);
}